

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void av1_enc_build_inter_predictor
               (AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,BUFFER_SET *ctx,
               BLOCK_SIZE bsize,int plane_from,int plane_to)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  char cVar3;
  PREDICTION_MODE PVar4;
  int dst_stride;
  MB_MODE_INFO *pMVar5;
  MB_MODE_INFO *pMVar6;
  WarpedMotionParams *pWVar7;
  ushort uVar8;
  macroblockd_plane *pmVar9;
  ulong uVar10;
  char cVar11;
  int iVar12;
  RefCntBuffer *pRVar13;
  InterpFilterParams *pIVar14;
  ulong uVar15;
  MB_MODE_INFO **ppMVar16;
  int col;
  long lVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  long lVar21;
  byte bVar22;
  uint uVar23;
  buf_2d *pbVar24;
  undefined7 in_register_00000089;
  bool bVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int x;
  undefined1 *puVar29;
  uint uVar30;
  bool bVar31;
  bool bVar32;
  macroblockd_plane *pd;
  MV mv;
  MV mv_1;
  WarpTypesAllowed warp_types;
  BUFFER_SET default_ctx;
  undefined8 local_1a8;
  INTERINTER_COMPOUND_DATA *local_1a0;
  ulong local_198;
  uint8_t *local_190;
  buf_2d *local_188;
  uint8_t *local_180;
  undefined4 local_174;
  uint local_170;
  int local_16c;
  int local_168;
  int_mv local_164;
  BUFFER_SET *local_160;
  long local_158;
  scale_factors **local_150;
  WarpTypesAllowed local_148;
  undefined1 local_140 [16];
  uint8_t *local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_110;
  CONV_BUF_TYPE *local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  uint local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  InterpFilterParams *local_e0;
  InterpFilterParams *local_d8;
  uint local_d0;
  uint local_cc;
  int local_c8;
  int local_c4;
  uint8_t *local_c0;
  uint8_t *puStack_b8;
  int local_b0;
  int iStack_ac;
  int iStack_a8;
  undefined4 uStack_a4;
  int local_a0;
  int local_9c;
  scale_factors *local_98;
  int local_90;
  uint local_8c;
  uint8_t *local_88;
  undefined8 uStack_80;
  BLOCK_SIZE local_78;
  uint local_74;
  int local_70;
  int local_6c;
  macroblockd_plane *local_68;
  long local_60;
  ulong local_58;
  scale_factors *local_50;
  scale_factors *local_48;
  long local_40;
  long local_38;
  
  local_174 = (int)CONCAT71(in_register_00000089,bsize);
  local_160 = ctx;
  if (plane_from <= plane_to) {
    local_68 = xd->plane;
    local_50 = &cm->sf_identity;
    local_150 = xd->block_ref_scale_factors;
    local_48 = cm->ref_scale_factors;
    lVar27 = (long)plane_from;
    lVar19 = lVar27 * 0xa30;
    do {
      pmVar9 = local_68;
      if ((lVar27 != 0) && (xd->is_chroma_ref != true)) {
        return;
      }
      pMVar5 = *xd->mi;
      bVar1 = local_68[lVar27].width;
      local_180 = (uint8_t *)CONCAT44(local_180._4_4_,(uint)local_68[lVar27].height);
      uVar10 = (ulong)pMVar5->bsize;
      cVar11 = (char)*(undefined2 *)&pMVar5->field_0xa7;
      local_158 = lVar19;
      if (cVar11 < '\0') {
LAB_002240bc:
        cVar3 = pMVar5->ref_frame[1];
        local_188 = &local_68[lVar27].dst;
        local_190 = local_68[lVar27].dst.buf;
        local_1a8 = 0;
        pWVar7 = xd->global_motion;
        PVar4 = pMVar5->mode;
        bVar20 = block_size_high[uVar10];
        if (block_size_wide[uVar10] < block_size_high[uVar10]) {
          bVar20 = block_size_wide[uVar10];
        }
        lVar26 = (ulong)('\0' < cVar3) + 1;
        lVar17 = 0;
        do {
          *(uint *)((long)&local_1a8 + lVar17 * 4) =
               (uint)((7 < bVar20 && (PVar4 - 0xf & 0xf7) == 0) &&
                     1 < pWVar7[pMVar5->ref_frame[lVar17]].wmtype);
          lVar17 = lVar17 + 1;
        } while (lVar26 != lVar17);
        iVar28 = pmVar9[lVar27].subsampling_x;
        local_198 = CONCAT44(local_198._4_4_,
                             (int)((mi_row - (uint)(pmVar9[lVar27].subsampling_y != 0 &&
                                                   (0x20005UL >> (uVar10 & 0x3f) & 1) != 0)) * 4) >>
                             ((byte)pmVar9[lVar27].subsampling_y & 0x1f));
        local_1a0 = &pMVar5->interinter_comp;
        lVar17 = 0;
        do {
          local_d0 = (uint)bVar1;
          local_98 = local_50;
          if (-1 < cVar11) {
            local_98 = local_150[lVar17];
          }
          pbVar24 = (buf_2d *)((long)local_150 + lVar19 + -0x1ec8);
          if (cVar11 < '\0') {
            pbVar24 = local_188;
          }
          local_164 = pMVar5->mv[lVar17];
          local_148.global_warp_allowed = *(int *)((long)&local_1a8 + lVar17 * 4);
          local_148.local_warp_allowed = (int)(pMVar5->motion_mode == '\x02');
          local_a0 = pmVar9[lVar27].subsampling_x;
          local_9c = pmVar9[lVar27].subsampling_y;
          local_90 = xd->bd;
          local_8c = (uint)xd->cur_buf->flags >> 3 & 1;
          uVar18 = (pMVar5->interp_filters).as_int;
          local_cc = (uint)local_180;
          local_c8 = (int)local_198;
          local_70 = (0x120U >> ((byte)local_9c & 0x1f)) * -0x400 + 0x1000;
          local_6c = (0x120U >> ((byte)local_a0 & 0x1f)) * -0x400 + 0x1000;
          uVar8 = *(ushort *)&pMVar5->field_0xa7 >> 7;
          local_74 = uVar8 & 1;
          local_140._0_8_ = (uint8_t *)0x0;
          if ((uVar8 & 1) == 0) {
            uVar15 = (ulong)(uVar18 >> 0xc & 0xff0);
            pIVar14 = (InterpFilterParams *)
                      ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar15);
            local_e0 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar15);
            if ((char)(uVar18 >> 0x10) == '\x04') {
              local_e0 = pIVar14;
            }
            if (4 < bVar1) {
              local_e0 = pIVar14;
            }
            uVar15 = (ulong)((uVar18 & 0xff) << 4);
            pIVar14 = (InterpFilterParams *)
                      ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar15);
            local_d8 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar15);
            if ((char)uVar18 == '\x04') {
              local_d8 = pIVar14;
            }
            if (4 < (byte)local_180) {
              local_d8 = pIVar14;
            }
          }
          else {
            local_d8 = &av1_intrabc_filter_params;
            local_e0 = &av1_intrabc_filter_params;
          }
          local_c0 = pbVar24->buf;
          puStack_b8 = pbVar24->buf0;
          local_b0 = pbVar24->width;
          iStack_ac = pbVar24->height;
          iStack_a8 = pbVar24->stride;
          uStack_a4 = *(undefined4 *)&pbVar24->field_0x1c;
          if (cVar3 < '\x01') {
            local_f8 = 0xb;
          }
          else {
            local_140._0_8_ = (uint8_t *)0x100000000;
            local_f8 = 7;
          }
          local_fc = 3;
          if ((10 < local_90) && (local_fc = local_90 + -7, cVar3 < '\x01')) {
            local_f8 = (local_f8 - local_90) + 10;
          }
          local_108 = xd->tmp_conv_dst;
          local_100 = 0x80;
          local_f4 = (int)lVar27;
          local_ec = 0;
          local_110 = (int)lVar17;
          local_f0 = (uint)('\0' < cVar3);
          local_c4 = (int)((mi_col - (uint)(iVar28 != 0 && (0x10003UL >> (uVar10 & 0x3f) & 1) != 0))
                          * 4) >> ((byte)iVar28 & 0x1f);
          av1_dist_wtd_comp_weight_assign
                    (cm,pMVar5,&local_e8,&local_e4,&local_ec,(uint)('\0' < cVar3));
          av1_init_warp_params((InterPredParams *)local_140,&local_148,(int)lVar17,xd,pMVar5);
          if (((pMVar5->interinter_comp).type & 0xfe) == 2) {
            local_78 = pMVar5->bsize;
            uStack_80._0_1_ = local_1a0->wedge_index;
            uStack_80._1_1_ = local_1a0->wedge_sign;
            uStack_80._2_1_ = local_1a0->mask_type;
            uStack_80._3_1_ = local_1a0->type;
            uStack_80._4_4_ = *(undefined4 *)&local_1a0->field_0xc;
            if (lVar17 == 1) {
              local_110 = 0;
              local_140._4_4_ = MASK_COMP;
            }
            local_88 = xd->seg_mask;
          }
          build_one_inter_predictor
                    (local_190,pmVar9[lVar27].dst.stride,&local_164.as_mv,
                     (InterPredParams *)local_140);
          lVar17 = lVar17 + 1;
          lVar19 = lVar19 + 0x20;
          lVar21 = lVar27;
        } while (lVar26 != lVar17);
      }
      else {
        iVar28 = local_68[lVar27].subsampling_y;
        bVar22 = (byte)(0x10003L >> (pMVar5->bsize & 0x3f));
        bVar20 = local_68[lVar27].subsampling_x != 0 & bVar22;
        bVar31 = (0x20005UL >> (uVar10 & 0x3f) & 1) != 0;
        bVar25 = iVar28 != 0 && bVar31;
        if ((bVar20 == 0) && (iVar28 == 0 || !bVar31)) goto LAB_002240bc;
        lVar21 = -(ulong)bVar20;
        lVar26 = -(ulong)bVar25;
        ppMVar16 = (MB_MODE_INFO **)((long)xd->mi + (long)xd->mi_stride * 8 * lVar26);
        bVar31 = false;
        lVar17 = lVar21;
        do {
          do {
            if (((ppMVar16[lVar17]->field_0xa7 & 0x80) != 0) ||
               (ppMVar16[lVar17]->ref_frame[0] < '\x01')) goto LAB_00223b60;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 1);
          ppMVar16 = ppMVar16 + xd->mi_stride;
          bVar31 = -1 < lVar26;
          bVar32 = lVar26 != 0;
          lVar17 = lVar21;
          lVar26 = lVar26 + 1;
        } while (bVar32);
LAB_00223b60:
        if (!bVar31) goto LAB_002240bc;
        bVar31 = iVar28 != 0;
        bVar32 = local_68[lVar27].subsampling_x != 0;
        uVar18 = (uint)(block_size_wide[uVar10] >> bVar32);
        uVar30 = (uint)(block_size_high[uVar10] >> bVar31);
        BVar2 = av1_ss_size_lookup[uVar10][bVar32][bVar31];
        local_170 = (uint)block_size_high[BVar2];
        cVar11 = pMVar5->ref_frame[1];
        bVar22 = bVar22 & bVar32;
        uVar23 = (uint)bVar25;
        iVar28 = -uVar23;
        local_58 = (ulong)(uint)((int)((mi_row - uVar23) * 4) >> bVar31);
        local_198 = (ulong)(uint)((int)((mi_col - (uint)bVar22) * 4) >> bVar32);
        local_1a0 = (INTERINTER_COMPOUND_DATA *)(ulong)block_size_wide[BVar2];
        local_40 = (ulong)(lVar27 != 1) * 8 + 0x510;
        local_168 = (uint)(cVar11 < '\x01') * 4 + 7;
        local_16c = (uint)(cVar11 < '\x01') * 4 + 0x11;
        local_60 = -(ulong)bVar22;
        pbVar24 = (buf_2d *)0x0;
        local_38 = lVar27;
        do {
          local_190 = (uint8_t *)CONCAT44(local_190._4_4_,(int)local_58 + (int)pbVar24);
          puVar29 = (undefined1 *)0x0;
          lVar19 = local_60;
          local_188 = pbVar24;
          do {
            lVar21 = local_38;
            pMVar6 = xd->mi[(long)iVar28 * (long)xd->mi_stride + lVar19];
            bVar1 = pMVar6->ref_frame[0];
            iVar12 = -1;
            if ((byte)(bVar1 - 1) < 8) {
              iVar12 = cm->remapped_ref_idx[bVar1 - 1];
            }
            if (iVar12 == -1) {
              pRVar13 = (RefCntBuffer *)0x0;
            }
            else {
              pRVar13 = cm->ref_frame_map[iVar12];
            }
            iVar12 = -1;
            if ((byte)(bVar1 - 1) < 8) {
              iVar12 = cm->remapped_ref_idx[bVar1 - 1];
            }
            dst_stride = pmVar9[lVar27].dst.stride;
            local_98 = (scale_factors *)0x0;
            if (iVar12 != -1) {
              local_98 = local_48 + iVar12;
            }
            local_180 = *(uint8_t **)((long)pRVar13->ref_order_hints + local_40 + -8);
            local_1a8 = CONCAT44(local_1a8._4_4_,pMVar6->mv[0].as_int);
            local_a0 = pmVar9[lVar27].subsampling_x;
            local_9c = pmVar9[lVar27].subsampling_y;
            local_90 = xd->bd;
            uVar23 = (pMVar6->interp_filters).as_int;
            local_c8 = (int)local_190;
            local_c4 = (int)local_198 + (int)puVar29;
            local_8c = (uint)xd->cur_buf->flags >> 3 & 1;
            local_70 = (0x120U >> ((byte)local_9c & 0x1f)) * -0x400 + 0x1000;
            local_6c = (0x120U >> ((byte)local_a0 & 0x1f)) * -0x400 + 0x1000;
            uVar8 = *(ushort *)&pMVar5->field_0xa7 >> 7;
            local_74 = uVar8 & 1;
            local_140._0_8_ = (uint8_t *)0x0;
            if ((uVar8 & 1) == 0) {
              uVar10 = (ulong)(uVar23 >> 0xc & 0xff0);
              pIVar14 = (InterpFilterParams *)
                        ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar10);
              local_e0 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar10);
              if ((char)(uVar23 >> 0x10) == '\x04') {
                local_e0 = pIVar14;
              }
              if (4 < uVar18) {
                local_e0 = pIVar14;
              }
              uVar10 = (ulong)((uVar23 & 0xff) << 4);
              pIVar14 = (InterpFilterParams *)
                        ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar10);
              local_d8 = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar10);
              if ((char)uVar23 == '\x04') {
                local_d8 = pIVar14;
              }
              if (4 < uVar30) {
                local_d8 = pIVar14;
              }
            }
            else {
              local_d8 = &av1_intrabc_filter_params;
              local_e0 = &av1_intrabc_filter_params;
            }
            local_c0 = (uint8_t *)0x0;
            iStack_ac = (pRVar13->buf).field_3.field_0.uv_crop_height;
            local_b0 = (pRVar13->buf).field_2.field_0.uv_crop_width;
            iStack_a8 = (pRVar13->buf).field_4.field_0.uv_stride;
            local_f8 = local_16c - local_90;
            if ('\0' < cVar11) {
              local_f8 = 7;
            }
            local_fc = local_90 + -7;
            if (local_90 < 0xb) {
              local_fc = 3;
            }
            local_110 = 0;
            local_108 = (CONV_BUF_TYPE *)0x0;
            local_100 = 0;
            if (local_90 < 0xb) {
              local_f8 = local_168;
            }
            local_f4 = (int)local_38;
            local_ec = 0;
            local_f0 = (uint)('\0' < cVar11);
            local_d0 = uVar18;
            local_cc = uVar30;
            puStack_b8 = local_180;
            build_one_inter_predictor
                      (puVar29 + (long)(pmVar9[lVar27].dst.buf + (int)local_188 * dst_stride),
                       dst_stride,(MV *)&local_1a8,(InterPredParams *)local_140);
            puVar29 = puVar29 + uVar18;
            lVar19 = lVar19 + 1;
          } while (puVar29 < local_1a0);
          iVar28 = iVar28 + 1;
          uVar23 = (int)local_188 + uVar30;
          pbVar24 = (buf_2d *)(ulong)uVar23;
        } while (uVar23 < local_170);
      }
      lVar19 = local_158;
      pMVar5 = *xd->mi;
      if (((('\0' < pMVar5->ref_frame[0]) && (pMVar5->ref_frame[1] == '\0')) &&
          (0xf8 < (byte)(pMVar5->bsize - BLOCK_32X64))) && (0xfb < (byte)(pMVar5->mode - 0x11))) {
        local_140._0_8_ = xd->plane[0].dst.buf;
        local_140._8_8_ = xd->plane[1].dst.buf;
        local_130 = xd->plane[2].dst.buf;
        local_128 = xd->plane[0].dst.stride;
        local_124 = xd->plane[1].dst.stride;
        local_120 = xd->plane[2].dst.stride;
        if (local_160 == (BUFFER_SET *)0x0) {
          local_160 = (BUFFER_SET *)local_140;
        }
        av1_build_interintra_predictor
                  (cm,xd,pmVar9[lVar27].dst.buf,pmVar9[lVar27].dst.stride,local_160,(int)lVar21,
                   (BLOCK_SIZE)local_174);
      }
      lVar27 = lVar21 + 1;
      lVar19 = lVar19 + 0xa30;
    } while (plane_to + 1 != (int)lVar27);
  }
  return;
}

Assistant:

void av1_enc_build_inter_predictor(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                   int mi_row, int mi_col,
                                   const BUFFER_SET *ctx, BLOCK_SIZE bsize,
                                   int plane_from, int plane_to) {
  for (int plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const int mi_x = mi_col * MI_SIZE;
    const int mi_y = mi_row * MI_SIZE;
    enc_build_inter_predictors(cm, xd, plane, xd->mi[0], xd->plane[plane].width,
                               xd->plane[plane].height, mi_x, mi_y);

    if (is_interintra_pred(xd->mi[0])) {
      BUFFER_SET default_ctx = {
        { xd->plane[0].dst.buf, xd->plane[1].dst.buf, xd->plane[2].dst.buf },
        { xd->plane[0].dst.stride, xd->plane[1].dst.stride,
          xd->plane[2].dst.stride }
      };
      if (!ctx) {
        ctx = &default_ctx;
      }
      av1_build_interintra_predictor(cm, xd, xd->plane[plane].dst.buf,
                                     xd->plane[plane].dst.stride, ctx, plane,
                                     bsize);
    }
  }
}